

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<TestFunction>,testing::Matcher<int>>,std::tuple<TestFunction,int>>
               (tuple<testing::Matcher<TestFunction>,_testing::Matcher<int>_> *matcher_tuple,
               tuple<TestFunction,_int> *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<TestFunction>,testing::Matcher<int>>,std::tuple<TestFunction,int>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<int>::Matches
                      ((MatcherBase<int> *)matcher_tuple,
                       (value_tuple->super__Tuple_impl<0UL,_TestFunction,_int>).
                       super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }